

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_282016::PeerManagerImpl::ReattemptInitialBroadcast
          (PeerManagerImpl *this,CScheduler *scheduler)

{
  _Rb_tree_header *p_Var1;
  Function f;
  _Base_ptr p_Var2;
  uint64_t uVar3;
  long in_FS_OFFSET;
  CTransactionRef tx;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> unbroadcast_txids;
  code *pcVar4;
  undefined1 local_f0 [136];
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CTxMemPool::GetUnbroadcastTxs
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)&local_68,this->m_mempool
            );
  p_Var1 = &local_68._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var2 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      CTxMemPool::get((CTxMemPool *)local_f0,(uint256 *)this->m_mempool);
      if (local_f0._0_8_ == 0) {
        CTxMemPool::RemoveUnbroadcastTx(this->m_mempool,(uint256 *)(p_Var2 + 1),true);
      }
      else {
        RelayTransaction(this,(uint256 *)(p_Var2 + 1),(uint256 *)(local_f0._0_8_ + 0x59));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  FastRandomContext::FastRandomContext((FastRandomContext *)local_f0,false);
  do {
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      ((RandomMixin<FastRandomContext> *)local_f0,0x13);
  } while (299999 < uVar3);
  ChaCha20::~ChaCha20((ChaCha20 *)(local_f0 + 0x10));
  pcVar4 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:1755:31)>
           ::_M_manager;
  f.super__Function_base._M_functor._8_8_ = scheduler;
  f.super__Function_base._M_functor._M_unused._M_object = this;
  f.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:1755:31)>
       ::_M_manager;
  f._M_invoker = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:1755:31)>
                 ::_M_invoke;
  CScheduler::scheduleFromNow(scheduler,f,(milliseconds)&stack0xfffffffffffffee8);
  if (pcVar4 != (code *)0x0) {
    (*pcVar4)(&stack0xfffffffffffffee8,&stack0xfffffffffffffee8,3);
  }
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ReattemptInitialBroadcast(CScheduler& scheduler)
{
    std::set<uint256> unbroadcast_txids = m_mempool.GetUnbroadcastTxs();

    for (const auto& txid : unbroadcast_txids) {
        CTransactionRef tx = m_mempool.get(txid);

        if (tx != nullptr) {
            RelayTransaction(txid, tx->GetWitnessHash());
        } else {
            m_mempool.RemoveUnbroadcastTx(txid, true);
        }
    }

    // Schedule next run for 10-15 minutes in the future.
    // We add randomness on every cycle to avoid the possibility of P2P fingerprinting.
    const auto delta = 10min + FastRandomContext().randrange<std::chrono::milliseconds>(5min);
    scheduler.scheduleFromNow([&] { ReattemptInitialBroadcast(scheduler); }, delta);
}